

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

CURLcode cf_cntrl_all(connectdata *conn,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                     void *arg2)

{
  Curl_cft_cntrl *pCVar1;
  CURLcode CVar2;
  long lVar3;
  Curl_cfilter *pCVar4;
  bool bVar5;
  
  lVar3 = 0;
  do {
    pCVar4 = conn->cfilter[lVar3];
    CVar2 = CURLE_OK;
    if (pCVar4 != (Curl_cfilter *)0x0) {
      CVar2 = CURLE_OK;
      do {
        pCVar1 = pCVar4->cft->cntrl;
        if (pCVar1 != Curl_cf_def_cntrl) {
          CVar2 = (*pCVar1)(pCVar4,data,event,arg1,(void *)0x0);
          if ((!ignore_result) && (CVar2 != CURLE_OK)) break;
        }
        pCVar4 = pCVar4->next;
      } while (pCVar4 != (Curl_cfilter *)0x0);
    }
    if ((CVar2 != CURLE_OK && !ignore_result) || (bVar5 = lVar3 != 0, lVar3 = lVar3 + 1, bVar5)) {
      return CVar2;
    }
  } while( true );
}

Assistant:

static CURLcode cf_cntrl_all(struct connectdata *conn,
                             struct Curl_easy *data,
                             bool ignore_result,
                             int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  size_t i;

  for(i = 0; i < CURL_ARRAYSIZE(conn->cfilter); ++i) {
    result = Curl_conn_cf_cntrl(conn->cfilter[i], data, ignore_result,
                                event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}